

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbor_parser.hpp
# Opt level: O3

void __thiscall
jsoncons::cbor::basic_cbor_parser<jsoncons::stream_source<unsigned_char>,_std::allocator<char>_>::
read_shape(basic_cbor_parser<jsoncons::stream_source<unsigned_char>,_std::allocator<char>_> *this,
          uint8_t info,error_code *ec)

{
  pointer puVar1;
  iterator iVar2;
  bool bVar3;
  size_t in_RAX;
  uint64_t uVar4;
  ulong uVar5;
  size_t dim;
  
  puVar1 = (this->shape_).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->shape_).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish != puVar1) {
    (this->shape_).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_finish = puVar1;
  }
  dim = in_RAX;
  if (info == '\x1f') {
    while (((this->source_).buffer_length_ != 0 ||
           (stream_source<unsigned_char>::fill_buffer(&this->source_),
           (this->source_).buffer_length_ != 0))) {
      if (*(this->source_).buffer_data_ == 0xff) {
        stream_source<unsigned_char>::ignore(&this->source_,1);
      }
      else {
        dim = get_uint64_value(this,ec);
        if (ec->_M_value != 0) {
          return;
        }
        iVar2._M_current =
             (this->shape_).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
             _M_impl.super__Vector_impl_data._M_finish;
        if (iVar2._M_current ==
            (this->shape_).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
            .super__Vector_impl_data._M_end_of_storage) {
          std::vector<unsigned_long,std::allocator<unsigned_long>>::
          _M_realloc_insert<unsigned_long_const&>
                    ((vector<unsigned_long,std::allocator<unsigned_long>> *)&this->shape_,iVar2,&dim
                    );
        }
        else {
          *iVar2._M_current = dim;
          (this->shape_).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_finish = iVar2._M_current + 1;
        }
      }
    }
    std::error_code::operator=(ec,unexpected_eof);
    this->more_ = false;
  }
  else {
    uVar4 = get_uint64_value(this,ec);
    if (((ec->_M_value == 0) && (uVar4 != 0)) && (this->more_ != false)) {
      uVar5 = 1;
      while (dim = get_uint64_value(this,ec), ec->_M_value == 0) {
        iVar2._M_current =
             (this->shape_).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
             _M_impl.super__Vector_impl_data._M_finish;
        if (iVar2._M_current ==
            (this->shape_).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
            .super__Vector_impl_data._M_end_of_storage) {
          std::vector<unsigned_long,std::allocator<unsigned_long>>::
          _M_realloc_insert<unsigned_long_const&>
                    ((vector<unsigned_long,std::allocator<unsigned_long>> *)&this->shape_,iVar2,&dim
                    );
        }
        else {
          *iVar2._M_current = dim;
          (this->shape_).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_finish = iVar2._M_current + 1;
        }
        if (this->more_ != true) {
          return;
        }
        bVar3 = uVar4 <= uVar5;
        uVar5 = uVar5 + 1;
        if (bVar3) {
          return;
        }
      }
    }
  }
  return;
}

Assistant:

void read_shape(uint8_t info, std::error_code& ec)
    {
        shape_.clear();
        switch (info)
        {
            case jsoncons::cbor::detail::additional_info::indefinite_length:
            {
                while (true)
                {
                    auto c = source_.peek();
                    if (JSONCONS_UNLIKELY(c.eof))
                    {
                        ec = cbor_errc::unexpected_eof;
                        more_ = false;
                        return;
                    }
                    if (c.value == 0xff)
                    {
                        source_.ignore(1);
                    }
                    else
                    {
                        std::size_t dim = get_size(ec);
                        if (JSONCONS_UNLIKELY(ec))
                        {
                            return;
                        }
                        shape_.push_back(dim);
                    }
                }
                break;
            }
            default:
            {
                std::size_t size = get_size(ec);
                if (JSONCONS_UNLIKELY(ec))
                {
                    return;
                }
                for (std::size_t i = 0; more_ && i < size; ++i)
                {
                    std::size_t dim = get_size(ec);
                    if (JSONCONS_UNLIKELY(ec))
                    {
                        return;
                    }
                    shape_.push_back(dim);
                }
                break;
            }
        }
    }